

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libntlmconnect.c
# Opt level: O0

int test(char *url)

{
  bool bVar1;
  bool bVar2;
  undefined8 uVar3;
  int iVar4;
  size_t sVar5;
  void *__ptr;
  undefined8 uVar6;
  CURL *pCVar7;
  long lVar8;
  int *piVar9;
  char *pcVar10;
  timeval tVar11;
  timeval older;
  timeval older_00;
  int local_394;
  int ec_15;
  int itimeout;
  CURLMcode ec_14;
  curl_socket_t curfd;
  _Bool socket_exists;
  CURLMcode ec_13;
  fd_set *__arr_2;
  uint __i_2;
  fd_set *__arr_1;
  uint __i_1;
  fd_set *__arr;
  uint __i;
  CURLMcode ec_12;
  CURLMcode ec_11;
  CURLcode ec_10;
  CURLcode ec_9;
  CURLcode ec_8;
  CURLcode ec_7;
  CURLcode ec_6;
  CURLcode ec_5;
  CURLcode ec_4;
  CURLcode ec_3;
  CURLcode ec_2;
  CURLcode ec_1;
  _Bool found_new_socket;
  long lStack_1f8;
  int maxfd;
  long timeout;
  fd_set fdexcep;
  fd_set fdwrite;
  fd_set fdread;
  timeval interval;
  __time_t _Stack_58;
  CURLcode ec;
  __suseconds_t local_50;
  char *full_url;
  size_t urllen;
  int local_30;
  HandleState state;
  int num_handles;
  int j;
  int i;
  int running;
  CURLM *multi;
  char *url_local;
  
  _i = 0;
  local_30 = 0;
  urllen._4_4_ = 0;
  multi = (CURLM *)url;
  sVar5 = strlen(url);
  sVar5 = sVar5 + 5;
  __ptr = malloc(sVar5);
  tVar11 = tutil_tvnow();
  _Stack_58 = tVar11.tv_sec;
  tv_test_start.tv_sec = _Stack_58;
  local_50 = tVar11.tv_usec;
  tv_test_start.tv_usec = local_50;
  if (__ptr == (void *)0x0) {
    curl_mfprintf(_stderr,"Not enough memory for full url\n");
    url_local._4_4_ = 0x7e;
  }
  else {
    for (num_handles = 0; num_handles < 3; num_handles = num_handles + 1) {
      easy[num_handles] = (CURL *)0x0;
      sockets[num_handles] = -1;
    }
    iVar4 = curl_global_init(3);
    uVar3 = _stderr;
    if (iVar4 != 0) {
      uVar6 = curl_easy_strerror(iVar4);
      curl_mfprintf(uVar3,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/libntlmconnect.c"
                    ,0x79,iVar4,uVar6);
      res = iVar4;
    }
    if (res == 0) {
      _i = curl_multi_init();
      if (_i == 0) {
        curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/libntlmconnect.c"
                      ,0x7f);
        res = 0x7b;
      }
joined_r0x00102488:
      if (res == 0) {
        do {
          lStack_1f8 = -99;
          ec_1 = ~(CURLE_USE_SSL_FAILED|CURLE_HTTP_POST_ERROR);
          bVar2 = false;
          if (urllen._4_4_ == 0) {
            pCVar7 = (CURL *)curl_easy_init();
            easy[local_30] = pCVar7;
            if (pCVar7 == (CURL *)0x0) {
              curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/libntlmconnect.c"
                            ,0x92);
              res = 0x7c;
            }
            if (res != 0) break;
            if (local_30 % 3 == 2) {
              curl_msnprintf(__ptr,sVar5,"%s0200",multi);
              iVar4 = curl_easy_setopt(easy[local_30],0x6b,8);
              uVar3 = _stderr;
              if (iVar4 != 0) {
                uVar6 = curl_easy_strerror(iVar4);
                curl_mfprintf(uVar3,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/libntlmconnect.c"
                              ,0x96,iVar4,uVar6);
                res = iVar4;
              }
            }
            else {
              curl_msnprintf(__ptr,sVar5,"%s0100",multi);
              iVar4 = curl_easy_setopt(easy[local_30],0x6b,1);
              uVar3 = _stderr;
              if (iVar4 != 0) {
                uVar6 = curl_easy_strerror(iVar4);
                curl_mfprintf(uVar3,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/libntlmconnect.c"
                              ,0x9a,iVar4,uVar6);
                res = iVar4;
              }
            }
            if (res != 0) break;
            iVar4 = curl_easy_setopt(easy[local_30],0x4a,1);
            uVar3 = _stderr;
            if (iVar4 != 0) {
              uVar6 = curl_easy_strerror(iVar4);
              curl_mfprintf(uVar3,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/libntlmconnect.c"
                            ,0x9c,iVar4,uVar6);
              res = iVar4;
            }
            if (res != 0) break;
            iVar4 = curl_easy_setopt(easy[local_30],0x2712,__ptr);
            uVar3 = _stderr;
            if (iVar4 != 0) {
              uVar6 = curl_easy_strerror(iVar4);
              curl_mfprintf(uVar3,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/libntlmconnect.c"
                            ,0x9d,iVar4,uVar6);
              res = iVar4;
            }
            if (res != 0) break;
            iVar4 = curl_easy_setopt(easy[local_30],0x29,1);
            uVar3 = _stderr;
            if (iVar4 != 0) {
              uVar6 = curl_easy_strerror(iVar4);
              curl_mfprintf(uVar3,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/libntlmconnect.c"
                            ,0x9e,iVar4,uVar6);
              res = iVar4;
            }
            if (res != 0) break;
            iVar4 = curl_easy_setopt(easy[local_30],0x50,1);
            uVar3 = _stderr;
            if (iVar4 != 0) {
              uVar6 = curl_easy_strerror(iVar4);
              curl_mfprintf(uVar3,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/libntlmconnect.c"
                            ,0x9f,iVar4,uVar6);
              res = iVar4;
            }
            if (res != 0) break;
            iVar4 = curl_easy_setopt(easy[local_30],0x2715,"testuser:testpass");
            uVar3 = _stderr;
            if (iVar4 != 0) {
              uVar6 = curl_easy_strerror(iVar4);
              curl_mfprintf(uVar3,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/libntlmconnect.c"
                            ,0xa0,iVar4,uVar6);
              res = iVar4;
            }
            if (res != 0) break;
            iVar4 = curl_easy_setopt(easy[local_30],0x4e2b,callback);
            uVar3 = _stderr;
            if (iVar4 != 0) {
              uVar6 = curl_easy_strerror(iVar4);
              curl_mfprintf(uVar3,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/libntlmconnect.c"
                            ,0xa1,iVar4,uVar6);
              res = iVar4;
            }
            if (res != 0) break;
            iVar4 = curl_easy_setopt(easy[local_30],0x2711,easy + local_30);
            uVar3 = _stderr;
            if (iVar4 != 0) {
              uVar6 = curl_easy_strerror(iVar4);
              curl_mfprintf(uVar3,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/libntlmconnect.c"
                            ,0xa2,iVar4,uVar6);
              res = iVar4;
            }
            if (res != 0) break;
            iVar4 = curl_easy_setopt(easy[local_30],0x2a,1);
            uVar3 = _stderr;
            if (iVar4 != 0) {
              uVar6 = curl_easy_strerror(iVar4);
              curl_mfprintf(uVar3,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/libntlmconnect.c"
                            ,0xa3,iVar4,uVar6);
              res = iVar4;
            }
            if (res != 0) break;
            iVar4 = curl_multi_add_handle(_i,easy[local_30]);
            uVar3 = _stderr;
            if (iVar4 != 0) {
              uVar6 = curl_multi_strerror(iVar4);
              curl_mfprintf(uVar3,"%s:%d curl_multi_add_handle() failed, with code %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/libntlmconnect.c"
                            ,0xa5,iVar4,uVar6);
              res = iVar4;
            }
            if (res != 0) break;
            local_30 = local_30 + 1;
            urllen._4_4_ = 1;
          }
          iVar4 = curl_multi_perform(_i,&j);
          uVar3 = _stderr;
          if (iVar4 == 0) {
            if (j < 0) {
              curl_mfprintf(_stderr,
                            "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/libntlmconnect.c"
                            ,0xaa,j);
              res = 0x7a;
            }
          }
          else {
            uVar6 = curl_multi_strerror(iVar4);
            curl_mfprintf(uVar3,"%s:%d curl_multi_perform() failed, with code %d (%s)\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/libntlmconnect.c"
                          ,0xaa,iVar4,uVar6);
            res = iVar4;
          }
          if (res != 0) break;
          tVar11 = tutil_tvnow();
          older.tv_usec = tv_test_start.tv_usec;
          older.tv_sec = tv_test_start.tv_sec;
          lVar8 = tutil_tvdiff(tVar11,older);
          if (5000 < lVar8) {
            curl_mfprintf(_stderr,
                          "%s:%d ABORTING TEST, since it seems that it would have run forever.\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/libntlmconnect.c"
                          ,0xac);
            res = 0x7d;
          }
          if ((res != 0) || ((j == 0 && (urllen._4_4_ == 2)))) break;
          for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
            fdwrite.__fds_bits[(ulong)__arr._4_4_ + 0xf] = 0;
          }
          for (__arr_1._4_4_ = 0; __arr_1._4_4_ < 0x10; __arr_1._4_4_ = __arr_1._4_4_ + 1) {
            fdexcep.__fds_bits[(ulong)__arr_1._4_4_ + 0xf] = 0;
          }
          for (__arr_2._4_4_ = 0; __arr_2._4_4_ < 0x10; __arr_2._4_4_ = __arr_2._4_4_ + 1) {
            fdexcep.__fds_bits[(ulong)__arr_2._4_4_ - 1] = 0;
          }
          iVar4 = curl_multi_fdset(_i,fdwrite.__fds_bits + 0xf,fdexcep.__fds_bits + 0xf,&timeout,
                                   &ec_1);
          uVar3 = _stderr;
          if (iVar4 == 0) {
            if ((int)ec_1 < -1) {
              curl_mfprintf(_stderr,
                            "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/libntlmconnect.c"
                            ,0xb5,ec_1);
              res = 0x7a;
            }
          }
          else {
            uVar6 = curl_multi_strerror(iVar4);
            curl_mfprintf(uVar3,"%s:%d curl_multi_fdset() failed, with code %d (%s)\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/libntlmconnect.c"
                          ,0xb5,iVar4,uVar6);
            res = iVar4;
          }
          if (res != 0) break;
          for (num_handles = 0; num_handles <= (int)ec_1; num_handles = num_handles + 1) {
            bVar1 = false;
            if ((fdwrite.__fds_bits[(long)(num_handles / 0x40) + 0xf] &
                1L << ((byte)((long)num_handles % 0x40) & 0x3f)) != 0) {
              for (state = ReadyForNewHandle; (int)state < local_30;
                  state = state + NeedSocketForNewHandle) {
                if (sockets[(int)state] == num_handles) {
                  bVar1 = true;
                  break;
                }
              }
              if (!bVar1) {
                if ((bVar2) || (urllen._4_4_ != 1)) {
                  curl_mfprintf(_stderr,"Unexpected new socket\n");
                  res = 0x7e;
                  goto LAB_0010345e;
                }
                if (sockets[local_30 + -1] != -1) {
                  if (num_handles == sockets[local_30 + -1]) {
                    __assert_fail("curfd != sockets[num_handles-1]",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/libntlmconnect.c"
                                  ,0xd8,"int test(char *)");
                  }
                  curl_mfprintf(_stderr,"Handle %d wrote to socket %d then detected on %d\n",
                                local_30 + -1,sockets[local_30 + -1],num_handles);
                  res = 0x7e;
                  goto LAB_0010345e;
                }
                sockets[local_30 + -1] = num_handles;
                bVar2 = true;
              }
            }
          }
          if (urllen._4_4_ != 1) goto LAB_00103195;
          if ((ec_1 == ~CURLE_OK) || (bVar2)) goto LAB_00103182;
          curl_mfprintf(_stderr,
                        "Warning: socket did not open immediately for new handle (trying again)\n");
        } while( true );
      }
LAB_0010345e:
      for (num_handles = 0; num_handles < 3; num_handles = num_handles + 1) {
        curl_multi_remove_handle(_i,easy[num_handles]);
        curl_easy_cleanup(easy[num_handles]);
      }
      curl_multi_cleanup(_i);
      curl_global_cleanup();
      free(__ptr);
      url_local._4_4_ = res;
    }
    else {
      free(__ptr);
      url_local._4_4_ = res;
    }
  }
  return url_local._4_4_;
LAB_00103182:
  urllen._4_4_ = 2;
  if (local_30 < 3) {
    urllen._4_4_ = 0;
  }
LAB_00103195:
  iVar4 = curl_multi_timeout(_i,&stack0xfffffffffffffe08);
  uVar3 = _stderr;
  if (iVar4 == 0) {
    if (lStack_1f8 < -1) {
      curl_mfprintf(_stderr,
                    "%s:%d curl_multi_timeout() succeeded, but returned invalid timeout value (%ld)\n"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/libntlmconnect.c"
                    ,0xef,lStack_1f8);
      res = 0x73;
    }
  }
  else {
    uVar6 = curl_multi_strerror(iVar4);
    curl_mfprintf(uVar3,"%s:%d curl_multi_timeout() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/libntlmconnect.c"
                  ,0xef,iVar4,uVar6);
    res = iVar4;
  }
  if (res != 0) goto LAB_0010345e;
  curl_mfprintf(_stderr,"%s:%d num_handles %d timeout %ld\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/libntlmconnect.c"
                ,0xf4,local_30,lStack_1f8);
  if (lStack_1f8 == -1) {
    fdread.__fds_bits[0xf] = 6;
    if ((j == 0) && (local_30 == 3)) goto LAB_0010345e;
  }
  else {
    if (lStack_1f8 < 0x80000000) {
      local_394 = (int)lStack_1f8;
    }
    else {
      local_394 = 0x7fffffff;
    }
    fdread.__fds_bits[0xf] = (__fd_mask)(local_394 / 1000);
  }
  iVar4 = select_wrapper(ec_1 + CURLE_UNSUPPORTED_PROTOCOL,(fd_set *)(fdwrite.__fds_bits + 0xf),
                         (fd_set *)(fdexcep.__fds_bits + 0xf),(fd_set *)&timeout,
                         (timeval *)(fdread.__fds_bits + 0xf));
  if (iVar4 == -1) {
    piVar9 = __errno_location();
    uVar3 = _stderr;
    iVar4 = *piVar9;
    pcVar10 = strerror(iVar4);
    curl_mfprintf(uVar3,"%s:%d select() failed, with errno %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/libntlmconnect.c"
                  ,0x107,iVar4,pcVar10);
    res = 0x79;
  }
  if (res != 0) goto LAB_0010345e;
  tVar11 = tutil_tvnow();
  older_00.tv_usec = tv_test_start.tv_usec;
  older_00.tv_sec = tv_test_start.tv_sec;
  lVar8 = tutil_tvdiff(tVar11,older_00);
  if (5000 < lVar8) {
    curl_mfprintf(_stderr,"%s:%d ABORTING TEST, since it seems that it would have run forever.\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/libntlmconnect.c"
                  ,0x109);
    res = 0x7d;
  }
  goto joined_r0x00102488;
}

Assistant:

int test(char *url)
{
  CURLM *multi = NULL;
  int running;
  int i, j;
  int num_handles = 0;
  enum HandleState state = ReadyForNewHandle;
  size_t urllen = strlen(url) + 4 + 1;
  char *full_url = malloc(urllen);

  start_test_timing();

  if(!full_url) {
    fprintf(stderr, "Not enough memory for full url\n");
    return TEST_ERR_MAJOR_BAD;
  }

  for(i = 0; i < MAX_EASY_HANDLES; ++i) {
    easy[i] = NULL;
    sockets[i] = CURL_SOCKET_BAD;
  }

  res_global_init(CURL_GLOBAL_ALL);
  if(res) {
    free(full_url);
    return res;
  }

  multi_init(multi);

#ifdef USE_PIPELINING
  multi_setopt(multi, CURLMOPT_PIPELINING, 1L);
  multi_setopt(multi, CURLMOPT_MAX_HOST_CONNECTIONS, 5L);
  multi_setopt(multi, CURLMOPT_MAX_TOTAL_CONNECTIONS, 10L);
#endif

  for(;;) {
    struct timeval interval;
    fd_set fdread;
    fd_set fdwrite;
    fd_set fdexcep;
    long timeout = -99;
    int maxfd = -99;
    bool found_new_socket = FALSE;

    /* Start a new handle if we aren't at the max */
    if(state == ReadyForNewHandle) {
      easy_init(easy[num_handles]);

      if(num_handles % 3 == 2) {
        snprintf(full_url, urllen, "%s0200", url);
        easy_setopt(easy[num_handles], CURLOPT_HTTPAUTH, CURLAUTH_NTLM);
      }
      else {
        snprintf(full_url, urllen, "%s0100", url);
        easy_setopt(easy[num_handles], CURLOPT_HTTPAUTH, CURLAUTH_BASIC);
      }
      easy_setopt(easy[num_handles], CURLOPT_FRESH_CONNECT, 1L);
      easy_setopt(easy[num_handles], CURLOPT_URL, full_url);
      easy_setopt(easy[num_handles], CURLOPT_VERBOSE, 1L);
      easy_setopt(easy[num_handles], CURLOPT_HTTPGET, 1L);
      easy_setopt(easy[num_handles], CURLOPT_USERPWD, "testuser:testpass");
      easy_setopt(easy[num_handles], CURLOPT_WRITEFUNCTION, callback);
      easy_setopt(easy[num_handles], CURLOPT_WRITEDATA, easy + num_handles);
      easy_setopt(easy[num_handles], CURLOPT_HEADER, 1L);

      multi_add_handle(multi, easy[num_handles]);
      num_handles += 1;
      state = NeedSocketForNewHandle;
    }

    multi_perform(multi, &running);

    abort_on_test_timeout();

    if(!running && state == NoMoreHandles)
      break; /* done */

    FD_ZERO(&fdread);
    FD_ZERO(&fdwrite);
    FD_ZERO(&fdexcep);

    multi_fdset(multi, &fdread, &fdwrite, &fdexcep, &maxfd);

    /* At this point, maxfd is guaranteed to be greater or equal than -1. */

    /* Any socket which is new in fdread is associated with the new handle */
    for(i = 0; i <= maxfd; ++i) {
      bool socket_exists = FALSE;
      curl_socket_t curfd = (curl_socket_t)i;

      if(!FD_ISSET(curfd, &fdread)) {
        continue;
      }

      /* Check if this socket was already detected for an earlier handle (or
         for this handle, num_handles-1, in the callback */
      for(j = 0; j < num_handles; ++j) {
        if(sockets[j] == curfd) {
          socket_exists = TRUE;
          break;
        }
      }
      if(socket_exists) {
        continue;
      }

      if(found_new_socket || state != NeedSocketForNewHandle) {
        fprintf(stderr, "Unexpected new socket\n");
        res = TEST_ERR_MAJOR_BAD;
        goto test_cleanup;
      }

      /* Now we know the socket is for the most recent handle, num_handles-1 */
      if(sockets[num_handles-1] != CURL_SOCKET_BAD) {
        /* A socket for this handle was already detected in the callback; if it
           matched socket_exists should be true and we would never get here */
        assert(curfd != sockets[num_handles-1]);
        fprintf(stderr, "Handle %d wrote to socket %d then detected on %d\n",
                num_handles-1, (int)sockets[num_handles-1], (int)curfd);
        res = TEST_ERR_MAJOR_BAD;
        goto test_cleanup;
      }
      else {
        sockets[num_handles-1] = curfd;
        found_new_socket = TRUE;
        /* continue to make sure there's only one new handle */
      }
    }

    if(state == NeedSocketForNewHandle) {
      if(maxfd != -1 && !found_new_socket) {
        fprintf(stderr, "Warning: socket did not open immediately for new "
                "handle (trying again)\n");
        continue;
      }
      state = num_handles < MAX_EASY_HANDLES ? ReadyForNewHandle
                                             : NoMoreHandles;
    }

    multi_timeout(multi, &timeout);

    /* At this point, timeout is guaranteed to be greater or equal than -1. */

    fprintf(stderr, "%s:%d num_handles %d timeout %ld\n",
            __FILE__, __LINE__, num_handles, timeout);

    if(timeout != -1L) {
      int itimeout = (timeout > (long)INT_MAX) ? INT_MAX : (int)timeout;
      interval.tv_sec = itimeout/1000;
      interval.tv_usec = (itimeout%1000)*1000;
    }
    else {
      interval.tv_sec = TEST_HANG_TIMEOUT/1000+1;
      interval.tv_usec = 0;

      /* if there's no timeout and we get here on the last handle, we may
         already have read the last part of the stream so waiting makes no
         sense */
      if(!running && num_handles == MAX_EASY_HANDLES) {
        break;
      }
    }

    select_test(maxfd+1, &fdread, &fdwrite, &fdexcep, &interval);

    abort_on_test_timeout();
  }

test_cleanup:

  /* proper cleanup sequence - type PB */

  for(i = 0; i < MAX_EASY_HANDLES; i++) {
    curl_multi_remove_handle(multi, easy[i]);
    curl_easy_cleanup(easy[i]);
  }

  curl_multi_cleanup(multi);
  curl_global_cleanup();

  free(full_url);

  return res;
}